

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

void OpenMesh::IO::assignCustomProperty<unsigned_short>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar2;
  unsigned_short local_30;
  value_type local_2e;
  BaseHandle local_2c;
  unsigned_short in;
  VPropHandleT<unsigned_short> prop;
  
  local_2c.idx_ = -1;
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  local_30 = 0;
  local_2c.idx_ =
       (int)PropertyContainer::handle<unsigned_short>
                      ((PropertyContainer *)(CONCAT44(extraout_var,iVar1) + 8),&local_30,_propName);
  if (local_2c.idx_ == -1) {
    iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<unsigned_short>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar1),
               (VPropHandleT<unsigned_short> *)&local_2c,_propName);
  }
  std::istream::_M_extract<unsigned_short>((ushort *)_in);
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar2 = BaseKernel::property<unsigned_short>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar1),
                      (VPropHandleT<unsigned_short>)local_2c.idx_,_vh);
  *pvVar2 = local_2e;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}